

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::FboUtil::FboBuilder::glAttach(FboBuilder *this,GLenum attPoint,Attachment *att)

{
  GLenum GVar1;
  Functions *pFVar2;
  long lVar3;
  GLuint GVar4;
  GLenum GVar5;
  
  pFVar2 = this->m_gl;
  if (att == (Attachment *)0x0) {
    GVar1 = this->m_target;
    GVar5 = 0x8d41;
    GVar4 = 0;
  }
  else {
    lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                           &FboUtil::config::RenderbufferAttachment::typeinfo,0);
    if (lVar3 == 0) {
      lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                             &FboUtil::config::TextureFlatAttachment::typeinfo,0);
      if (lVar3 == 0) {
        lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                               &FboUtil::config::TextureLayerAttachment::typeinfo,0);
        if (lVar3 != 0) {
          (*pFVar2->framebufferTextureLayer)
                    (*(GLenum *)(lVar3 + 8),attPoint,*(GLuint *)(lVar3 + 0xc),
                     *(GLint *)(lVar3 + 0x10),*(GLint *)(lVar3 + 0x14));
        }
      }
      else {
        (*pFVar2->framebufferTexture2D)
                  (*(GLenum *)(lVar3 + 8),attPoint,*(GLenum *)(lVar3 + 0x14),
                   *(GLuint *)(lVar3 + 0xc),*(GLint *)(lVar3 + 0x10));
      }
      goto LAB_014aa7f4;
    }
    GVar5 = *(GLenum *)(lVar3 + 0x10);
    GVar1 = *(GLenum *)(lVar3 + 8);
    GVar4 = *(GLuint *)(lVar3 + 0xc);
  }
  (*pFVar2->framebufferRenderbuffer)(GVar1,attPoint,GVar5,GVar4);
LAB_014aa7f4:
  checkError(this);
  FboUtil::config::Framebuffer::attach(&this->super_Framebuffer,attPoint,att);
  return;
}

Assistant:

void FboBuilder::glAttach (GLenum attPoint, const Attachment* att)
{
	if (att == NULL)
		m_gl.framebufferRenderbuffer(m_target, attPoint, GL_RENDERBUFFER, 0);
	else
		attachAttachment(*att, attPoint, m_gl);
	checkError();
	attach(attPoint, att);
}